

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  _func_void_FieldDescriptor_ptr *buffer;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var1;
  int iVar2;
  FieldDescriptor *pFVar3;
  long lVar4;
  bool bVar5;
  EnumDescriptor *pEVar6;
  Descriptor *pDVar7;
  mapped_type *pmVar8;
  LogMessage *other;
  long *plVar9;
  Options *options_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *pFVar11;
  string *psVar12;
  char *pcVar13;
  string scope;
  string name;
  undefined1 local_150 [56];
  undefined1 local_118 [48];
  key_type local_e8;
  cpp *local_c8;
  string *local_c0;
  key_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined1 local_90 [32];
  key_type local_70;
  undefined1 local_50 [32];
  
  this->descriptor_ = descriptor;
  psVar12 = &this->type_traits_;
  local_98 = &(this->type_traits_).field_2;
  (this->type_traits_)._M_dataplus._M_p = (pointer)local_98;
  (this->type_traits_)._M_string_length = 0;
  (this->type_traits_).field_2._M_local_buf[0] = '\0';
  local_c8 = (cpp *)&this->options_;
  local_c0 = psVar12;
  Options::Options((Options *)local_c8,options);
  this->scc_analyzer_ = scc_analyzer;
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  options_00 = (Options *)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((~(byte)this->descriptor_[1] & 0x60) == 0) {
    options_00 = (Options *)0x434639;
    std::__cxx11::string::_M_replace
              ((ulong)psVar12,0,(char *)(this->type_traits_)._M_string_length,0x434639);
  }
  pFVar3 = this->descriptor_;
  if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
    local_150._0_8_ = FieldDescriptor::TypeOnceInit;
    local_118._0_8_ = pFVar3;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)local_150,
               (FieldDescriptor **)local_118);
  }
  iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar3[2] * 4);
  if (iVar2 == 10) {
    std::__cxx11::string::append((char *)psVar12);
    pDVar7 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_((string *)local_150,(cpp *)pDVar7,(Descriptor *)0x1,SUB81(options_00,0));
    std::__cxx11::string::_M_append((char *)psVar12,local_150._0_8_);
  }
  else {
    if (iVar2 == 9) goto LAB_002e1217;
    if (iVar2 == 8) {
      std::__cxx11::string::append((char *)psVar12);
      pEVar6 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)local_150,(cpp *)pEVar6,(EnumDescriptor *)0x1,SUB81(options_00,0));
      std::__cxx11::string::_M_append((char *)psVar12,local_150._0_8_);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_);
      }
      std::__cxx11::string::append((char *)psVar12);
      pEVar6 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)local_150,(cpp *)pEVar6,(EnumDescriptor *)0x1,SUB81(options_00,0));
      std::__cxx11::string::_M_append((char *)psVar12,local_150._0_8_);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_);
      }
      goto LAB_002e1217;
    }
    std::__cxx11::string::append((char *)psVar12);
    pFVar3 = this->descriptor_;
    if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
      local_118._0_8_ = FieldDescriptor::TypeOnceInit;
      local_90._0_8_ = pFVar3;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)local_118,
                 (FieldDescriptor **)local_90);
    }
    PrimitiveTypeName_abi_cxx11_
              ((string *)local_150,local_c8,
               (Options *)
               (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar3[2] * 4),
               (CppType)options_00);
    psVar12 = local_c0;
    std::__cxx11::string::_M_append((char *)local_c0,local_150._0_8_);
  }
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_);
  }
LAB_002e1217:
  std::__cxx11::string::append((char *)psVar12);
  SetCommonVars(options,variables);
  QualifiedClassName_abi_cxx11_
            ((string *)local_150,*(cpp **)(this->descriptor_ + 0x20),(Descriptor *)local_c8,
             options_00);
  pFVar3 = (FieldDescriptor *)(local_118 + 0x10);
  local_118._0_8_ = pFVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"extendee","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_118);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_150);
  if ((FieldDescriptor *)local_118._0_8_ != pFVar3) {
    operator_delete((void *)local_118._0_8_);
  }
  buffer = (_func_void_FieldDescriptor_ptr *)(local_150 + 0x10);
  if ((_func_void_FieldDescriptor_ptr *)local_150._0_8_ != buffer) {
    operator_delete((void *)local_150._0_8_);
  }
  local_150._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"type_traits","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_150);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((_func_void_FieldDescriptor_ptr *)local_150._0_8_ != buffer) {
    operator_delete((void *)local_150._0_8_);
  }
  local_90._0_8_ = local_90 + 0x10;
  lVar4 = **(long **)(this->descriptor_ + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,lVar4,(*(long **)(this->descriptor_ + 8))[1] + lVar4);
  ResolveKeyword((string *)local_150,(string *)local_90);
  local_118._0_8_ = pFVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_118);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_150);
  pFVar11 = extraout_RDX;
  if ((FieldDescriptor *)local_118._0_8_ != pFVar3) {
    operator_delete((void *)local_118._0_8_);
    pFVar11 = extraout_RDX_00;
  }
  if ((_func_void_FieldDescriptor_ptr *)local_150._0_8_ != buffer) {
    operator_delete((void *)local_150._0_8_);
    pFVar11 = extraout_RDX_01;
  }
  FieldConstantName_abi_cxx11_((string *)local_150,(cpp *)this->descriptor_,pFVar11);
  local_118._0_8_ = pFVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"constant_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_118);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_150);
  if ((FieldDescriptor *)local_118._0_8_ != pFVar3) {
    operator_delete((void *)local_118._0_8_);
  }
  if ((_func_void_FieldDescriptor_ptr *)local_150._0_8_ != buffer) {
    operator_delete((void *)local_150._0_8_);
  }
  pFVar11 = this->descriptor_;
  if (*(once_flag **)(pFVar11 + 0x18) != (once_flag *)0x0) {
    local_e8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_50._0_8_ = pFVar11;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar11 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e8,
               (FieldDescriptor **)local_50);
  }
  local_150._0_8_ = buffer;
  local_150._8_8_ = FastInt32ToBufferLeft((uint)(byte)pFVar11[2],(char *)buffer);
  local_150._8_8_ = local_150._8_8_ + -(long)buffer;
  local_118._0_8_ = pFVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,local_150._0_8_,(char *)(local_150._8_8_ + local_150._0_8_));
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"field_type","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_118._0_8_ != pFVar3) {
    operator_delete((void *)local_118._0_8_);
  }
  bVar5 = FieldDescriptor::is_packed(this->descriptor_);
  pcVar13 = "false";
  if (bVar5) {
    pcVar13 = "true";
  }
  local_150._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"packed","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_150);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar13);
  if ((_func_void_FieldDescriptor_ptr *)local_150._0_8_ != buffer) {
    operator_delete((void *)local_150._0_8_);
  }
  bVar5 = IsScoped(this);
  if (bVar5) {
    pFVar11 = this->descriptor_;
    pDVar7 = extraout_RDX_02;
    if (((byte)pFVar11[1] & 8) == 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_150,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.h"
                 ,0x8d0);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_150,"CHECK failed: is_extension_: ");
      internal::LogFinisher::operator=((LogFinisher *)local_118,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_150);
      pDVar7 = extraout_RDX_03;
    }
    ClassName_abi_cxx11_((string *)local_50,*(cpp **)(pFVar11 + 0x28),pDVar7);
    plVar9 = (long *)std::__cxx11::string::append(local_50);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar10) {
      local_e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_e8.field_2._8_8_ = plVar9[3];
    }
    else {
      local_e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_e8._M_string_length = plVar9[1];
    *plVar9 = (long)paVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
  }
  else {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  }
  if ((bVar5) && ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10))) {
    operator_delete((void *)local_50._0_8_);
  }
  local_118._0_8_ = pFVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"scope","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_118);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  pFVar11 = extraout_RDX_04;
  if ((FieldDescriptor *)local_118._0_8_ != pFVar3) {
    operator_delete((void *)local_118._0_8_);
    pFVar11 = extraout_RDX_05;
  }
  ExtensionName_abi_cxx11_((string *)local_118,(cpp *)this->descriptor_,pFVar11);
  paVar10 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"scoped_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar10) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_118._0_8_ != pFVar3) {
    operator_delete((void *)local_118._0_8_);
  }
  local_118._0_8_ = pFVar3;
  pcVar13 = FastInt32ToBufferLeft(*(int32 *)(this->descriptor_ + 4),(char *)pFVar3);
  local_118._8_8_ = (long)pcVar13 - (long)pFVar3;
  local_b8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,local_118._0_8_,
             (FieldDescriptor *)(local_118._0_8_ + local_118._8_8_));
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"number","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_70);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar10) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_90._0_8_ != (FieldDescriptor *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_);
  }
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options,
                                       MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor), options_(options), scc_analyzer_(scc_analyzer) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(options_, descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
  SetCommonVars(options, &variables_);
  variables_["extendee"] =
      QualifiedClassName(descriptor_->containing_type(), options_);
  variables_["type_traits"] = type_traits_;
  std::string name = descriptor_->name();
  variables_["name"] = ResolveKeyword(name);
  variables_["constant_name"] = FieldConstantName(descriptor_);
  variables_["field_type"] =
      StrCat(static_cast<int>(descriptor_->type()));
  variables_["packed"] = descriptor_->is_packed() ? "true" : "false";

  std::string scope =
      IsScoped() ? ClassName(descriptor_->extension_scope(), false) + "::" : "";
  variables_["scope"] = scope;
  variables_["scoped_name"] = ExtensionName(descriptor_);
  variables_["number"] = StrCat(descriptor_->number());
}